

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtil.hpp
# Opt level: O2

string * limonp::Trim(string *s)

{
  string *psVar1;
  
  psVar1 = RTrim(s);
  psVar1 = LTrim(psVar1);
  return psVar1;
}

Assistant:

inline std::string& Trim(std::string &s) {
  return LTrim(RTrim(s));
}